

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O3

int __thiscall
H264StreamReader::writeSEIMessage
          (H264StreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,SEIUnit *sei,
          uint8_t payloadType)

{
  _Rb_tree_color _Var1;
  byte *pbVar2;
  SPSUnit *sps;
  _Base_ptr p_Var3;
  undefined4 *puVar4;
  int iVar5;
  _Base_ptr p_Var6;
  const_iterator __begin3;
  byte *pbVar7;
  _Base_ptr p_Var8;
  uint8_t *puVar9;
  int iVar10;
  bool bVar11;
  ostringstream ss;
  uint8_t tmpBuffer [256];
  char *local_320;
  BitStreamWriter local_318;
  uint *local_2f8;
  undefined8 local_2f0;
  uint local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  uint *local_2d8;
  undefined8 local_2d0;
  uint local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  uint8_t *local_2b8;
  ostringstream local_2b0 [376];
  uint local_138 [66];
  
  if ((long)dstEnd - (long)dstBuffer < 4) {
    std::__cxx11::ostringstream::ostringstream(local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"H264 stream error: Not enough buffer for write headers",0x36);
    puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar4 = 3;
    *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
    if (local_2d8 == &local_2c8) {
      puVar4[6] = local_2c8;
      puVar4[7] = uStack_2c4;
      puVar4[8] = uStack_2c0;
      puVar4[9] = uStack_2bc;
    }
    else {
      *(uint **)(puVar4 + 2) = local_2d8;
      *(ulong *)(puVar4 + 6) = CONCAT44(uStack_2c4,local_2c8);
    }
    *(undefined8 *)(puVar4 + 4) = local_2d0;
    local_2d0 = 0;
    local_2c8 = local_2c8 & 0xffffff00;
    local_2d8 = &local_2c8;
    __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  puVar9 = dstBuffer;
  if ((this->super_MPEGStreamReader).m_shortStartCodes == false) {
    puVar9 = dstBuffer + 1;
    *dstBuffer = '\0';
  }
  puVar9[0] = '\0';
  puVar9[1] = '\0';
  puVar9[2] = '\x01';
  local_318.super_BitStream.m_totalBits = 0x800;
  local_318.super_BitStream.m_buffer = local_138;
  local_318.m_curVal = 0;
  local_318.m_bitWrited = 0;
  bVar11 = this->m_mvcSubStream;
  local_318.super_BitStream.m_initBuffer = local_318.super_BitStream.m_buffer;
  local_2b8 = dstEnd;
  BitStreamWriter::putBits(&local_318,8,6);
  if (bVar11 == true) {
    BitStreamWriter::putBits(&local_318,8,0x25);
    iVar5 = (int)local_318.super_BitStream.m_buffer - (int)local_318.super_BitStream.m_initBuffer;
    iVar10 = local_318.m_bitWrited + iVar5 * 8;
    iVar5 = local_318.m_bitWrited + iVar5 * 8 + 7;
    if (-1 < iVar10) {
      iVar5 = iVar10;
    }
    local_320 = (char *)((long)(iVar5 >> 3) + (long)local_318.super_BitStream.m_initBuffer);
    BitStreamWriter::putBits(&local_318,8,0);
    iVar10 = ((int)local_318.super_BitStream.m_initBuffer - (int)local_318.super_BitStream.m_buffer)
             * 8 - local_318.m_bitWrited;
    pbVar7 = (this->m_lastSeiMvcHeader).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar2 = (this->m_lastSeiMvcHeader).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pbVar7 == pbVar2) {
      BitStreamWriter::putBits(&local_318,8,0xc0);
      BitStreamWriter::putBits(&local_318,8,0x10);
    }
    else {
      do {
        BitStreamWriter::putBits(&local_318,8,(uint)*pbVar7);
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != pbVar2);
    }
  }
  else {
    iVar10 = 0;
    local_320 = (char *)0x0;
  }
  BitStreamWriter::putBits(&local_318,8,(uint)payloadType);
  p_Var6 = (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &(this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != (_Base_ptr)0x0) {
    _Var1 = this->m_lastSliceSPS;
    p_Var8 = p_Var3;
    do {
      bVar11 = p_Var6[1]._M_color < _Var1;
      if (!bVar11) {
        p_Var8 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar11];
    } while (p_Var6 != (_Base_ptr)0x0);
    if ((p_Var8 != p_Var3) && (p_Var8[1]._M_color <= _Var1)) {
      p_Var3 = p_Var8;
    }
  }
  puVar9 = puVar9 + 3;
  sps = (SPSUnit *)p_Var3[1]._M_parent;
  if (sps != (SPSUnit *)0x0) {
    if (payloadType == '\0') {
      SEIUnit::serialize_buffering_period_message(sei,sps,&local_318,false);
    }
    else {
      SEIUnit::serialize_pic_timing_message(sei,sps,&local_318,false);
    }
    if (local_320 != (char *)0x0) {
      *local_320 = (char)(iVar10 + local_318.m_bitWrited >> 3) +
                   ((char)local_318.super_BitStream.m_buffer -
                   (char)local_318.super_BitStream.m_initBuffer);
    }
    NALUnit::write_rbsp_trailing_bits(&local_318);
    BitStreamWriter::flushBits(&local_318);
    iVar10 = local_318.m_bitWrited +
             ((int)local_318.super_BitStream.m_buffer - (int)local_318.super_BitStream.m_initBuffer)
             * 8;
    iVar5 = local_318.m_bitWrited +
            ((int)local_318.super_BitStream.m_buffer - (int)local_318.super_BitStream.m_initBuffer)
            * 8 + 7;
    if (-1 < iVar10) {
      iVar5 = iVar10;
    }
    iVar10 = NALUnit::encodeNAL((uint8_t *)local_138,
                                (uint8_t *)((long)local_138 + (long)(iVar5 >> 3)),puVar9,
                                (long)local_2b8 - (long)puVar9);
    if (iVar10 == -1) {
      std::__cxx11::ostringstream::ostringstream(local_2b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2b0,"H264 stream error: Not enough buffer for write headers",0x36)
      ;
      puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar4 = 3;
      *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
      if (local_2f8 == &local_2e8) {
        puVar4[6] = local_2e8;
        puVar4[7] = uStack_2e4;
        puVar4[8] = uStack_2e0;
        puVar4[9] = uStack_2dc;
      }
      else {
        *(uint **)(puVar4 + 2) = local_2f8;
        *(ulong *)(puVar4 + 6) = CONCAT44(uStack_2e4,local_2e8);
      }
      *(undefined8 *)(puVar4 + 4) = local_2f0;
      local_2f0 = 0;
      local_2e8 = local_2e8 & 0xffffff00;
      local_2f8 = &local_2e8;
      __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    puVar9 = puVar9 + iVar10;
  }
  return (int)puVar9 - (int)dstBuffer;
}

Assistant:

int H264StreamReader::writeSEIMessage(uint8_t *dstBuffer, const uint8_t *dstEnd, const SEIUnit &sei,
                                      const uint8_t payloadType) const
{
    uint8_t *curPos = dstBuffer;

    if (dstEnd - curPos < 4)
        THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")

    uint8_t tmpBuffer[256];
    BitStreamWriter writer{};
    curPos = writeNalPrefix(curPos);
    writer.setBuffer(tmpBuffer, tmpBuffer + sizeof(tmpBuffer));

    uint8_t *sizeField = nullptr;
    unsigned beforeMessageLen = 0;
    if (m_mvcSubStream)
    {
        writer.putBits(8, static_cast<int>(NALUnit::NALType::nuSEI));
        writer.putBits(8, SEI_MSG_MVC_SCALABLE_NESTING);

        sizeField = writer.getBuffer() + writer.getBitsCount() / 8;
        writer.putBits(8, 0);  // skip size field
        beforeMessageLen = writer.getBitsCount();

        static constexpr uint8_t DEFAULT_MVC_SEI_HEADER[] = {192, 16};
        if (!m_lastSeiMvcHeader.empty())
        {
            for (const auto &i : m_lastSeiMvcHeader) writer.putBits(8, i);
        }
        else
        {
            writer.putBits(8, DEFAULT_MVC_SEI_HEADER[0]);
            writer.putBits(8, DEFAULT_MVC_SEI_HEADER[1]);
        }

        writer.putBits(8, payloadType);
    }
    else
    {
        writer.putBits(8, static_cast<int>(NALUnit::NALType::nuSEI));
        writer.putBits(8, payloadType);
    }

    const SPSUnit *sps = m_spsMap.find(m_lastSliceSPS)->second;
    if (sps)
    {
        if (payloadType == 0)
            sei.serialize_buffering_period_message(*sps, writer, false);

        else
            sei.serialize_pic_timing_message(*sps, writer, false);

        if (sizeField)
        {
            const unsigned msgLen = writer.getBitsCount() - beforeMessageLen;
            *sizeField = static_cast<uint8_t>(msgLen / 8);
        }
        SEIUnit::write_rbsp_trailing_bits(writer);
        writer.flushBits();

        const int sRez = SEIUnit::encodeNAL(tmpBuffer, tmpBuffer + writer.getBitsCount() / 8, curPos, dstEnd - curPos);
        if (sRez == -1)
            THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
        curPos += sRez;
    }

    return static_cast<int>(curPos - dstBuffer);
}